

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O1

void __thiscall QPDFMatrix::concat(QPDFMatrix *this,QPDFMatrix *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = this->c;
  dVar2 = other->a;
  dVar3 = other->b;
  dVar4 = this->a;
  dVar5 = this->b;
  dVar6 = this->d;
  dVar7 = other->c;
  dVar8 = other->d;
  dVar9 = other->e;
  dVar10 = other->f;
  this->a = dVar4 * dVar2 + dVar1 * dVar3;
  this->b = dVar2 * dVar5 + dVar3 * dVar6;
  this->c = dVar4 * dVar7 + dVar1 * dVar8;
  this->d = dVar7 * dVar5 + dVar8 * dVar6;
  this->e = dVar4 * dVar9 + dVar1 * dVar10 + this->e;
  this->f = dVar5 * dVar9 + dVar6 * dVar10 + this->f;
  return;
}

Assistant:

void
QPDFMatrix::concat(QPDFMatrix const& other)
{
    double ap = (this->a * other.a) + (this->c * other.b);
    double bp = (this->b * other.a) + (this->d * other.b);
    double cp = (this->a * other.c) + (this->c * other.d);
    double dp = (this->b * other.c) + (this->d * other.d);
    double ep = (this->a * other.e) + (this->c * other.f) + this->e;
    double fp = (this->b * other.e) + (this->d * other.f) + this->f;
    this->a = ap;
    this->b = bp;
    this->c = cp;
    this->d = dp;
    this->e = ep;
    this->f = fp;
}